

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smodels.cpp
# Opt level: O3

void __thiscall Potassco::SmodelsInput::matchBody(SmodelsInput *this,RuleBuilder *rule)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  Atom_t AVar4;
  bool bVar5;
  
  uVar2 = ProgramReader::matchPos(&this->super_ProgramReader,0xffffffff,"unsigned integer expected")
  ;
  uVar3 = ProgramReader::matchPos(&this->super_ProgramReader,0xffffffff,"unsigned integer expected")
  ;
  RuleBuilder::startBody(rule);
  for (; uVar2 != 0; uVar2 = uVar2 - 1) {
    AVar4 = ProgramReader::matchAtom(&this->super_ProgramReader,"atom expected");
    bVar5 = uVar3 == 0;
    uVar3 = uVar3 - 1;
    uVar1 = -AVar4;
    if (bVar5) {
      uVar3 = 0;
      uVar1 = AVar4;
    }
    RuleBuilder::addGoal(rule,(WeightLit_t)((ulong)uVar1 | 0x100000000));
  }
  return;
}

Assistant:

void SmodelsInput::matchBody(RuleBuilder& rule) {
	uint32_t len = matchPos();
	uint32_t neg = matchPos();
	for (rule.startBody(); len--;) {
		Lit_t p = lit(matchAtom());
		if (neg) { p *= -1; --neg; }
		rule.addGoal(p);
	}
}